

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseDataModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  Result result;
  pointer pDVar2;
  unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  local_110;
  Enum local_104;
  size_t local_100;
  size_t local_f8;
  char *local_f0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_e8;
  Enum local_dc;
  Var local_d8;
  Enum local_90;
  Enum local_8c;
  Enum local_88;
  Enum local_84;
  undefined4 local_80;
  Enum local_7c;
  undefined1 local_78 [8];
  __single_object field;
  string name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  result = Expect(this,Data);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  std::__cxx11::string::string((string *)&field);
  ParseBindVarOpt(this,(string *)&field);
  std::make_unique<wabt::DataSegmentModuleField,wabt::Location&,std::__cxx11::string&>
            ((Location *)local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  bVar1 = PeekMatchLpar(this,Memory);
  if (bVar1) {
    local_7c = (Enum)Expect(this,Lpar);
    bVar1 = Failed((Result)local_7c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_001a5221;
    }
    local_84 = (Enum)Expect(this,Memory);
    bVar1 = Failed((Result)local_84);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_001a5221;
    }
    pDVar2 = std::
             unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
             ::operator->((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                           *)local_78);
    local_88 = (Enum)ParseVar(this,&(pDVar2->data_segment).memory_var);
    bVar1 = Failed((Result)local_88);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_001a5221;
    }
    local_8c = (Enum)Expect(this,Rpar);
    bVar1 = Failed((Result)local_8c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_001a5221;
    }
    pDVar2 = std::
             unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
             ::operator->((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                           *)local_78);
    local_90 = (Enum)ParseOffsetExpr(this,&(pDVar2->data_segment).offset);
    bVar1 = Failed((Result)local_90);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_001a5221;
    }
  }
  else {
    pDVar2 = std::
             unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
             ::operator->((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                           *)local_78);
    Var::Var(&local_d8,0,(Location *)local_48);
    bVar1 = ParseVarOpt(this,&(pDVar2->data_segment).memory_var,&local_d8);
    Var::~Var(&local_d8);
    if (bVar1) {
      pDVar2 = std::
               unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
               ::operator->((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                             *)local_78);
      local_dc = (Enum)ParseOffsetExpr(this,&(pDVar2->data_segment).offset);
      bVar1 = Failed((Result)local_dc);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_001a5221;
      }
    }
    else {
      pDVar2 = std::
               unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
               ::operator->((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                             *)local_78);
      bVar1 = ParseOffsetExprOpt(this,&(pDVar2->data_segment).offset);
      if (!bVar1) {
        bVar1 = Features::bulk_memory_enabled(&this->options_->features);
        if (!bVar1) {
          local_100 = (size_t)local_48;
          local_f8 = loc.filename._M_len;
          local_f0 = loc.filename._M_str;
          local_e8.offset = (size_t)loc.field_1.field_1.offset;
          Error(this,0x257a11);
          Result::Result((Result *)((long)&this_local + 4),Error);
          goto LAB_001a5221;
        }
        pDVar2 = std::
                 unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                 ::operator->((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                               *)local_78);
        (pDVar2->data_segment).kind = Passive;
      }
    }
  }
  pDVar2 = std::
           unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
           ::operator->((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                         *)local_78);
  ParseTextListOpt(this,&(pDVar2->data_segment).data);
  local_104 = (Enum)Expect(this,Rpar);
  bVar1 = Failed((Result)local_104);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    std::
    unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>::
    unique_ptr(&local_110,
               (unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                *)local_78);
    Module::AppendField(module,&local_110);
    std::
    unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>::
    ~unique_ptr(&local_110);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
LAB_001a5221:
  local_80 = 1;
  std::unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  ::~unique_ptr((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                 *)local_78);
  std::__cxx11::string::~string((string *)&field);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseDataModuleField(Module* module) {
  WABT_TRACE(ParseDataModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Data);
  std::string name;
  ParseBindVarOpt(&name);
  auto field = std::make_unique<DataSegmentModuleField>(loc, name);

  if (PeekMatchLpar(TokenType::Memory)) {
    EXPECT(Lpar);
    EXPECT(Memory);
    CHECK_RESULT(ParseVar(&field->data_segment.memory_var));
    EXPECT(Rpar);
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (ParseVarOpt(&field->data_segment.memory_var, Var(0, loc))) {
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (!ParseOffsetExprOpt(&field->data_segment.offset)) {
    if (!options_->features.bulk_memory_enabled()) {
      Error(loc, "passive data segments are not allowed");
      return Result::Error;
    }

    field->data_segment.kind = SegmentKind::Passive;
  }

  ParseTextListOpt(&field->data_segment.data);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}